

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::EdgeChainSimplifier::OutputAllEdges(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  VertexOutEdgeIds VVar1;
  VertexOutEdgeIds VVar2;
  EdgeId e;
  int iVar3;
  EdgeId e_1;
  
  VVar1 = Graph::VertexOutMap::edge_ids(&this->out_,v0,v1);
  VVar2 = VVar1;
  while (iVar3 = VVar2.begin_, VVar1.end_ != iVar3) {
    OutputEdge(this,iVar3);
    VVar2.begin_ = iVar3 + 1;
    VVar2.end_ = 0;
  }
  VVar2 = Graph::VertexOutMap::edge_ids(&this->out_,v1,v0);
  VVar1 = VVar2;
  while (iVar3 = VVar1.begin_, VVar2.end_ != iVar3) {
    OutputEdge(this,iVar3);
    VVar1.begin_ = iVar3 + 1;
    VVar1.end_ = 0;
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::OutputAllEdges(VertexId v0, VertexId v1) {
  for (EdgeId e : out_.edge_ids(v0, v1)) OutputEdge(e);
  for (EdgeId e : out_.edge_ids(v1, v0)) OutputEdge(e);
}